

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

int neverbleed_load_private_key_file(neverbleed_t *nb,SSL_CTX *ctx,char *fn,char *errbuf)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  st_neverbleed_thread_data_t *psVar5;
  char *str;
  char *pcVar6;
  undefined8 *puVar7;
  RSA *r;
  EVP_PKEY *pkey;
  EC_KEY *key;
  EC_GROUP *group;
  EC_POINT *pub;
  int *piVar8;
  char *__format;
  size_t sStack_80;
  BIGNUM *e;
  char *local_68;
  BIGNUM *local_60;
  expbuf_t local_58;
  
  local_68 = errbuf;
  psVar5 = get_thread_data(nb);
  local_58.end = (char *)0x0;
  local_58.capacity = 0;
  local_58.buf = (char *)0x0;
  local_58.start = (char *)0x0;
  expbuf_push_str(&local_58,"load_key");
  expbuf_push_str(&local_58,fn);
  iVar4 = expbuf_write(&local_58,psVar5->fd);
  if (iVar4 == 0) {
    expbuf_dispose(&local_58);
    iVar4 = expbuf_read(&local_58,psVar5->fd);
    if (iVar4 == 0) {
      plVar3 = (long *)local_58.start;
      if ((7 < (ulong)((long)local_58.end - (long)local_58.start)) &&
         (7 < ((long)local_58.end - (long)local_58.start) - 8U)) {
        lVar1 = *(long *)((long)local_58.start + 8);
        plVar3 = (long *)((long)local_58.start + 0x10);
        if (*(long *)local_58.start == 2) {
          if (7 < (ulong)((long)local_58.end - (long)plVar3)) {
            lVar2 = *(long *)((long)local_58.start + 0x10);
            local_58.start = (char *)((long)local_58.start + 0x18);
            pcVar6 = expbuf_shift_str(&local_58);
            plVar3 = (long *)local_58.start;
            if (pcVar6 != (char *)0x0) {
              e = (BIGNUM *)0x0;
              puVar7 = (undefined8 *)malloc(0x10);
              if (puVar7 != (undefined8 *)0x0) {
                *puVar7 = nb;
                puVar7[1] = lVar1;
                key = (EC_KEY *)EC_KEY_new_method(nb->engine);
                EC_KEY_set_ex_data(key,0,puVar7);
                group = EC_GROUP_new_by_curve_name((int)lVar2);
                if (group == (EC_GROUP *)0x0) {
                  pcVar6 = "could not create EC_GROUP\n";
                  sStack_80 = 0x1a;
                }
                else {
                  EC_KEY_set_group(key,group);
                  iVar4 = BN_hex2bn((BIGNUM **)&e,pcVar6);
                  if (iVar4 == 0) {
                    __format = "failed to parse ECDSA ephemeral public key:%s\n";
                    goto LAB_001820ec;
                  }
                  pub = EC_POINT_bn2point(group,(BIGNUM *)e,(EC_POINT *)0x0,(BN_CTX *)0x0);
                  if (pub != (EC_POINT *)0x0) {
                    EC_KEY_set_public_key(key,pub);
                    pkey = EVP_PKEY_new();
                    EVP_PKEY_set1_EC_KEY(pkey,key);
                    EC_POINT_free(pub);
                    BN_free((BIGNUM *)e);
                    EC_GROUP_free(group);
                    EC_KEY_free(key);
                    goto LAB_00181fbd;
                  }
                  pcVar6 = "failed to get ECDSA ephemeral public key from BIGNUM\n";
                  sStack_80 = 0x35;
                }
                goto LAB_0018210b;
              }
              goto LAB_00182085;
            }
          }
        }
        else if (*(long *)local_58.start == 1) {
          local_58.start = (char *)plVar3;
          str = expbuf_shift_str(&local_58);
          plVar3 = (long *)local_58.start;
          if ((str != (char *)0x0) &&
             (pcVar6 = expbuf_shift_str(&local_58), plVar3 = (long *)local_58.start,
             pcVar6 != (char *)0x0)) {
            e = (BIGNUM *)0x0;
            local_60 = (BIGNUM *)0x0;
            puVar7 = (undefined8 *)malloc(0x10);
            if (puVar7 != (undefined8 *)0x0) {
              *puVar7 = nb;
              puVar7[1] = lVar1;
              r = RSA_new_method((ENGINE *)nb->engine);
              RSA_set_ex_data(r,0,puVar7);
              iVar4 = BN_hex2bn((BIGNUM **)&e,str);
              if (iVar4 == 0) {
                __format = "failed to parse e:%s\n";
                pcVar6 = str;
              }
              else {
                iVar4 = BN_hex2bn(&local_60,pcVar6);
                if (iVar4 != 0) {
                  RSA_set0_key(r,local_60,e,0);
                  RSA_set_flags(r,0x20);
                  pkey = EVP_PKEY_new();
                  EVP_PKEY_set1_RSA(pkey,r);
                  RSA_free(r);
LAB_00181fbd:
                  expbuf_dispose(&local_58);
                  iVar4 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pkey);
                  if (iVar4 != 1) {
                    builtin_strncpy(local_68,"SSL_CTX_use_PrivateKey failed",0x1e);
                  }
                  EVP_PKEY_free(pkey);
                  return (uint)(iVar4 == 1);
                }
                __format = "failed to parse n:%s\n";
              }
LAB_001820ec:
              fprintf(_stderr,__format,pcVar6);
              abort();
            }
LAB_00182085:
            pcVar6 = "no memory\n";
            sStack_80 = 10;
LAB_0018210b:
            fwrite(pcVar6,sStack_80,1,_stderr);
            abort();
          }
        }
        else {
          local_58.start = (char *)plVar3;
          pcVar6 = expbuf_shift_str(&local_58);
          plVar3 = (long *)local_58.start;
          if (pcVar6 != (char *)0x0) {
            snprintf(local_68,0x100,"%s",pcVar6);
            return -1;
          }
        }
      }
      local_58.start = (char *)plVar3;
      piVar8 = __errno_location();
      *piVar8 = 0;
      pcVar6 = "failed to parse response";
      goto LAB_0018207e;
    }
    piVar8 = __errno_location();
    iVar4 = *piVar8;
    pcVar6 = "read error";
  }
  else {
    piVar8 = __errno_location();
    iVar4 = *piVar8;
    pcVar6 = "write error";
  }
  if (iVar4 == 0) {
    pcVar6 = "connection closed by daemon";
  }
LAB_0018207e:
  dief(pcVar6);
}

Assistant:

int neverbleed_load_private_key_file(neverbleed_t *nb, SSL_CTX *ctx, const char *fn, char *errbuf)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    int ret = 1;
    size_t index, type;
    EVP_PKEY *pkey;

    expbuf_push_str(&buf, "load_key");
    expbuf_push_str(&buf, fn);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &type) != 0 || expbuf_shift_num(&buf, &index) != 0) {
        errno = 0;
        dief("failed to parse response");
    }

    switch (type) {
    case NEVERBLEED_TYPE_RSA: {
        char *estr, *nstr;

        if ((estr = expbuf_shift_str(&buf)) == NULL || (nstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = create_pkey(nb, index, estr, nstr);
        break;
    }
#if OPENSSL_1_1_API
    case NEVERBLEED_TYPE_ECDSA: {
        char *ec_pubkeystr;
        size_t curve_name;

        if (expbuf_shift_num(&buf, &curve_name) != 0 || (ec_pubkeystr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = ecdsa_create_pkey(nb, index, curve_name, ec_pubkeystr);
        break;
    }
#endif
    default: {
        char *errstr;

        if ((errstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }

        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "%s", errstr);
        return -1;
    }
    }

    expbuf_dispose(&buf);

    /* success */
    if (SSL_CTX_use_PrivateKey(ctx, pkey) != 1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "SSL_CTX_use_PrivateKey failed");
        ret = 0;
    }

    EVP_PKEY_free(pkey);
    return ret;
}